

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O0

string * __thiscall soul::Type::getDescription_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  anon_class_1_0_00000001 local_39;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  local_38;
  Type *local_18;
  Type *this_local;
  
  local_18 = this;
  this_local = (Type *)__return_storage_ptr__;
  std::function<std::__cxx11::string(soul::Structure_const&)>::
  function<soul::Type::getDescription()const::__0,void>
            ((function<std::__cxx11::string(soul::Structure_const&)> *)&local_38,&local_39);
  getDescription(__return_storage_ptr__,this,&local_38);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  ::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Type::getDescription() const
{
    return getDescription ([] (const Structure& s) { return s.getName(); });
}